

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O2

void __thiscall
miniros::ServiceCallback::ServiceCallback
          (ServiceCallback *this,ServiceCallbackHelperPtr *helper,shared_ptr<unsigned_char[]> *buf,
          size_t num_bytes,ServiceClientLinkPtr *link,bool has_tracked_object,
          VoidConstWPtr *tracked_object)

{
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__ServiceCallback_002f15c0;
  std::__shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->helper_).
              super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>,
             &helper->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->buffer_).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>,
             &buf->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>);
  this->num_bytes_ = (uint32_t)num_bytes;
  std::__shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->link_).
              super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>,
             &link->super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>);
  this->has_tracked_object_ = has_tracked_object;
  std::__weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&(this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>,
             &tracked_object->super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

ServiceCallback(const ServiceCallbackHelperPtr& helper, const std::shared_ptr<uint8_t[]>& buf, size_t num_bytes,
          const ServiceClientLinkPtr& link, bool has_tracked_object, const VoidConstWPtr& tracked_object)
  : helper_(helper)
  , buffer_(buf)
  , num_bytes_(num_bytes)
  , link_(link)
  , has_tracked_object_(has_tracked_object)
  , tracked_object_(tracked_object)
  {
  }